

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

RealType __thiscall OpenMD::EAMAdapter::getDr(EAMAdapter *this)

{
  FuncflParameters funcflParam;
  undefined8 local_60;
  
  getFuncflParam((EAMAdapter *)funcflParam.dr);
  FuncflParameters::~FuncflParameters(local_60);
  return (RealType)local_60;
}

Assistant:

RealType EAMAdapter::getDr() {
    FuncflParameters funcflParam = getFuncflParam();
    return funcflParam.dr;
  }